

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O1

tuple<unsigned_long,_unsigned_long> __thiscall Environment::Get(Environment *this,size_t symbol)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  string *psVar4;
  ostream *poVar5;
  size_t in_RDX;
  long *plVar6;
  _Head_base<0UL,_unsigned_long,_false> _Var7;
  pointer puVar8;
  long lVar9;
  pointer puVar10;
  pointer puVar11;
  long *plVar12;
  tuple<unsigned_long,_unsigned_long> tVar13;
  
  lVar9 = *(long *)(symbol + 8);
  puVar8 = (this->slot_map).
           super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->slot_map).
            super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = (pointer)0x0;
  do {
    if (lVar9 == *(long *)symbol) {
      (this->slot_map).
      super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar10;
      (this->slot_map).
      super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar8;
      if (g_options.emit_warnings == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: possibly unbound symbol: ",0x22);
        psVar4 = SymbolInterner::GetSymbol_abi_cxx11_(in_RDX);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(psVar4->_M_dataplus)._M_p,
                            psVar4->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      tVar13 = DefineGlobal(this,symbol);
      _Var7 = tVar13.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      goto LAB_00115dd3;
    }
    plVar6 = (long *)(in_RDX % *(ulong *)(lVar9 + -0x30));
    _Var7._M_head_impl = *(long *)(*(long *)(lVar9 + -0x38) + (long)plVar6 * 8);
    plVar2 = (long *)0x0;
    if (((long *)_Var7._M_head_impl != (long *)0x0) &&
       (plVar2 = (long *)_Var7._M_head_impl, plVar12 = *(long **)_Var7._M_head_impl,
       (*(long **)_Var7._M_head_impl)[1] != in_RDX)) {
      while (plVar1 = (long *)*plVar12, plVar1 != (long *)0x0) {
        _Var7._M_head_impl = (ulong)plVar1[1] % *(ulong *)(lVar9 + -0x30);
        plVar2 = (long *)0x0;
        if (((long *)_Var7._M_head_impl != plVar6) ||
           (plVar2 = plVar12, plVar12 = plVar1, plVar1[1] == in_RDX)) goto LAB_00115d21;
      }
      plVar2 = (long *)0x0;
    }
LAB_00115d21:
    if (plVar2 == (long *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *plVar2;
    }
    if (lVar3 == 0) {
      puVar11 = (pointer)((long)&(puVar11->_M_h)._M_buckets + 1);
    }
    else {
      puVar8 = *(pointer *)(lVar3 + 0x10);
      puVar10 = puVar11;
    }
    lVar9 = lVar9 + -0x38;
  } while (lVar3 == 0);
  (this->slot_map).
  super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar10;
  (this->slot_map).
  super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar8;
LAB_00115dd3:
  tVar13.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = _Var7._M_head_impl;
  tVar13.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_long,_unsigned_long>)
         tVar13.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
}

Assistant:

std::tuple<size_t, size_t> Environment::Get(size_t symbol) {
  // starting at the most recent lexical environment, search upwards
  // until we find what we're looking for.
  size_t up_index = 0;
  for (auto it = slot_map.rbegin(); it != slot_map.rend(); it++) {
    auto entry = it->find(symbol);
    if (entry != it->end()) {
      // we found it. the second entry of this map is the right_index
      return std::make_tuple(up_index, std::get<1>(entry->second));
    }

    up_index++;
  }

  if (g_options.emit_warnings) {
    std::cerr << "warning: possibly unbound symbol: "
              << SymbolInterner::GetSymbol(symbol) << std::endl;
  }

  return DefineGlobal(symbol);
}